

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhugeint.cpp
# Opt level: O3

int __thiscall duckdb::Sign(duckdb *this,uhugeint_t n)

{
  uhugeint_t local_28;
  
  uhugeint_t::uhugeint_t(&local_28,0);
  return (int)(local_28.lower < this && local_28.upper == n.lower || local_28.upper < n.lower);
}

Assistant:

int Sign(uhugeint_t n) {
	return (n > 0);
}